

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void re2::hashword2(uint32 *k,size_t length,uint32 *pc,uint32 *pb)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint local_34;
  uint local_30;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32 *pb_local;
  uint32 *pc_local;
  size_t length_local;
  uint32 *k_local;
  
  local_30 = (int)(length << 2) + -0x21524111 + *pc;
  local_34 = *pb + local_30;
  c = local_30;
  length_local = (size_t)k;
  for (pc_local = (uint32 *)length; (uint32 *)0x3 < pc_local;
      pc_local = (uint32 *)((long)pc_local + -3)) {
    iVar1 = *(int *)(length_local + 4) + local_30;
    local_34 = *(int *)(length_local + 8) + local_34;
    uVar2 = (local_34 * 0x10 | local_34 >> 0x1c) ^ (*(int *)length_local + c) - local_34;
    iVar3 = iVar1 + local_34;
    uVar4 = (uVar2 << 6 | uVar2 >> 0x1a) ^ iVar1 - uVar2;
    iVar1 = iVar3 + uVar2;
    uVar2 = (uVar4 << 8 | uVar4 >> 0x18) ^ iVar3 - uVar4;
    iVar3 = iVar1 + uVar4;
    uVar4 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar1 - uVar2;
    iVar1 = iVar3 + uVar2;
    local_30 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar3 - uVar4;
    c = iVar1 + uVar4;
    local_34 = (local_30 << 4 | local_30 >> 0x1c) ^ iVar1 - local_30;
    local_30 = c + local_30;
    length_local = length_local + 0xc;
  }
  switch(pc_local) {
  case (uint32 *)0x3:
    local_34 = *(int *)(length_local + 8) + local_34;
  case (uint32 *)0x2:
    local_30 = *(int *)(length_local + 4) + local_30;
  case (uint32 *)0x1:
    uVar2 = (local_30 ^ local_34) - (local_30 << 0xe | local_30 >> 0x12);
    uVar4 = (uVar2 ^ *(int *)length_local + c) - (uVar2 * 0x800 | uVar2 >> 0x15);
    uVar5 = (uVar4 ^ local_30) - (uVar4 * 0x2000000 | uVar4 >> 7);
    uVar2 = (uVar5 ^ uVar2) - (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar4 = (uVar2 ^ uVar4) - (uVar2 * 0x10 | uVar2 >> 0x1c);
    local_30 = (uVar4 ^ uVar5) - (uVar4 * 0x4000 | uVar4 >> 0x12);
    local_34 = (local_30 ^ uVar2) - (local_30 * 0x1000000 | local_30 >> 8);
  case (uint32 *)0x0:
  default:
    *pc = local_34;
    *pb = local_30;
    return;
  }
}

Assistant:

void hashword2 (
const uint32 *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32       *pc,                      /* IN: seed OUT: primary hash value */
uint32       *pb)               /* IN: more seed OUT: secondary hash value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + ((uint32_t)(length<<2)) + *pc;
  c += *pb;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  *pc=c; *pb=b;
}